

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSExportEntry *
add_export_entry2(JSContext *ctx,JSParseState *s,JSModuleDef *m,JSAtom param_4,JSAtom export_name,
                 JSExportTypeEnum export_type)

{
  JSExportEntry *pJVar1;
  JSAtomStruct *pJVar2;
  JSExportEntry *pJVar3;
  int iVar4;
  JSExportEntry *pJVar5;
  char *pcVar6;
  long lVar7;
  char buf1 [64];
  char acStack_78 [72];
  
  iVar4 = m->export_entries_count;
  lVar7 = (long)iVar4;
  if (0 < lVar7) {
    pJVar5 = m->export_entries;
    do {
      if (pJVar5->export_name == export_name) goto LAB_0012c456;
      pJVar5 = pJVar5 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    pJVar5 = (JSExportEntry *)0x0;
LAB_0012c456:
    if (pJVar5 != (JSExportEntry *)0x0) {
      if (s != (JSParseState *)0x0) {
        pcVar6 = JS_AtomGetStrRT(ctx->rt,acStack_78,export_name,(JSAtom)lVar7);
        js_parse_error(s,"duplicate exported name \'%s\'",pcVar6);
        return (JSExportEntry *)0x0;
      }
      pcVar6 = JS_AtomGetStrRT(ctx->rt,acStack_78,export_name,(JSAtom)lVar7);
      JS_ThrowSyntaxError(ctx,"duplicate exported name \'%s\'",pcVar6);
      return (JSExportEntry *)0x0;
    }
  }
  if ((m->export_entries_size <= iVar4) &&
     (iVar4 = js_realloc_array(ctx,&m->export_entries,0x20,&m->export_entries_size,iVar4 + 1),
     iVar4 != 0)) {
    return (JSExportEntry *)0x0;
  }
  pJVar1 = m->export_entries;
  iVar4 = m->export_entries_count;
  m->export_entries_count = iVar4 + 1;
  pJVar5 = pJVar1 + iVar4;
  pJVar3 = pJVar1 + iVar4;
  pJVar3->export_type = JS_EXPORT_TYPE_LOCAL;
  pJVar3->local_name = 0;
  *(undefined8 *)(&pJVar3->export_type + 2) = 0;
  *(undefined8 *)&pJVar1[iVar4].u = 0;
  pJVar1[iVar4].u.local.var_ref = (JSVarRef *)0x0;
  if (0xd1 < (int)param_4) {
    pJVar2 = ctx->rt->atom_array[param_4];
    (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
  }
  pJVar5->local_name = param_4;
  if (0xd1 < (int)export_name) {
    pJVar2 = ctx->rt->atom_array[export_name];
    (pJVar2->header).ref_count = (pJVar2->header).ref_count + 1;
  }
  pJVar5->export_name = export_name;
  pJVar5->export_type = export_type;
  return pJVar5;
}

Assistant:

static JSExportEntry *add_export_entry2(JSContext *ctx,
                                        JSParseState *s, JSModuleDef *m,
                                       JSAtom local_name, JSAtom export_name,
                                       JSExportTypeEnum export_type)
{
    JSExportEntry *me;

    if (find_export_entry(ctx, m, export_name)) {
        char buf1[ATOM_GET_STR_BUF_SIZE];
        if (s) {
            js_parse_error(s, "duplicate exported name '%s'",
                           JS_AtomGetStr(ctx, buf1, sizeof(buf1), export_name));
        } else {
            JS_ThrowSyntaxErrorAtom(ctx, "duplicate exported name '%s'", export_name);
        }
        return NULL;
    }

    if (js_resize_array(ctx, (void **)&m->export_entries,
                        sizeof(JSExportEntry),
                        &m->export_entries_size,
                        m->export_entries_count + 1))
        return NULL;
    me = &m->export_entries[m->export_entries_count++];
    memset(me, 0, sizeof(*me));
    me->local_name = JS_DupAtom(ctx, local_name);
    me->export_name = JS_DupAtom(ctx, export_name);
    me->export_type = export_type;
    return me;
}